

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_event_queue.cpp
# Opt level: O3

void __thiscall sc_core::sc_event_queue::cancel_all(sc_event_queue *this)

{
  void *pvVar1;
  
  this->m_pending_delta = 0;
  if (0 < (this->m_ppq).super_sc_ppq_base.m_heap_size) {
    do {
      pvVar1 = sc_ppq_base::extract_top(&(this->m_ppq).super_sc_ppq_base);
      operator_delete(pvVar1);
    } while (0 < (this->m_ppq).super_sc_ppq_base.m_heap_size);
  }
  sc_event::cancel(&this->m_e);
  return;
}

Assistant:

void sc_event_queue::cancel_all()
{
    m_pending_delta = 0;
    while( m_ppq.size() > 0 )
	delete m_ppq.extract_top();
    m_e.cancel();
}